

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool trans_BXJ(DisasContext_conflict1 *s,arg_BXJ *a)

{
  TCGContext_conflict1 *pTVar1;
  _Bool _Var2;
  TCGTemp *pTVar3;
  TCGv_i32 var;
  
  if ((s->isar->id_isar1 < 0x10000000) || ((s->features & 0x200) != 0)) {
    _Var2 = false;
  }
  else {
    pTVar1 = s->uc->tcg_ctx;
    pTVar3 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I32,false);
    var = (TCGv_i32)((long)pTVar3 - (long)pTVar1);
    load_reg_var(s,var,(int)a);
    pTVar1 = s->uc->tcg_ctx;
    (s->base).is_jmp = DISAS_TARGET_0;
    tcg_gen_andi_i32_aarch64(pTVar1,pTVar1->cpu_R[0xf],var,-2);
    tcg_gen_andi_i32_aarch64(pTVar1,var,var,1);
    tcg_gen_op3_aarch64(pTVar1,INDEX_op_st_i32,(TCGArg)(var + (long)pTVar1),
                        (TCGArg)(pTVar1->cpu_env + (long)pTVar1),0x220);
    tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(var + (long)pTVar1));
    _Var2 = true;
  }
  return _Var2;
}

Assistant:

static bool trans_BXJ(DisasContext *s, arg_BXJ *a)
{
    if (!ENABLE_ARCH_5J || arm_dc_feature(s, ARM_FEATURE_M)) {
        return false;
    }
    /* Trivial implementation equivalent to bx.  */
    gen_bx(s, load_reg(s, a->rm));
    return true;
}